

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O1

int cmp(void *param_1,void *param_2)

{
  int iVar1;
  
  iVar1 = 1;
  if (*param_1 <= *param_2) {
    iVar1 = -(uint)(*param_1 < *param_2);
  }
  return iVar1;
}

Assistant:

int cmp(const void *a, const void *b)
{
    struct str *a1 = (struct str *)a;
    struct str *a2 = (struct str *)b;
    if ((*a1).value > (*a2).value)
        return 1;
    else if ((*a1).value < (*a2).value)
        return -1;
    else
        return 0;
}